

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O1

int hugeRead(void *context,char *buffer,int len)

{
  char *pcVar1;
  size_t sVar2;
  ulong __n;
  int iVar3;
  
  pcVar1 = current;
  __n = 0xffffffff;
  if (len < 0 || (buffer == (char *)0x0 || context == (void *)0x0)) goto LAB_00102c35;
  if (instate == 2) {
    __n = (ulong)(uint)rlen;
    iVar3 = rlen - len;
    if (iVar3 == 0 || rlen < len) {
      sVar2 = (size_t)rlen;
      rlen = 0;
      memcpy(buffer,current,sVar2);
      instate = 3;
      curlen = 0;
      goto LAB_00102c35;
    }
  }
  else {
    if (instate == 1) {
      __n = 0x1000;
      if (len < 0x1000) {
        __n = (ulong)(uint)len;
      }
      memcpy(buffer,filling,__n);
      curlen = curlen + __n;
      if (curlen < maxlen) {
        if (dotlen < curlen) {
          fputc(0x2e,_stderr);
          dotlen = dotlen + maxlen / 10;
        }
      }
      else {
        pcVar1 = hugeTests[currentTest].end;
        sVar2 = strlen(pcVar1);
        rlen = (int)sVar2;
        instate = 2;
        current = pcVar1;
      }
      goto LAB_00102c35;
    }
    __n = 0;
    if (instate != 0) goto LAB_00102c35;
    __n = (ulong)(uint)rlen;
    iVar3 = rlen - len;
    if (iVar3 == 0 || rlen < len) {
      sVar2 = (size_t)rlen;
      rlen = 0;
      memcpy(buffer,current,sVar2);
      instate = 1;
      curlen = 0;
      dotlen = maxlen / 10;
      goto LAB_00102c35;
    }
  }
  memcpy(buffer,current,(ulong)(uint)len);
  __n = (ulong)(uint)len;
  rlen = iVar3;
  current = pcVar1 + (uint)len;
LAB_00102c35:
  return (int)__n;
}

Assistant:

static int
hugeRead(void *context, char *buffer, int len)
{
    if ((context == NULL) || (buffer == NULL) || (len < 0))
        return (-1);

    if (instate == 0) {
        if (len >= rlen) {
            len = rlen;
            rlen = 0;
            memcpy(buffer, current, len);
            instate = 1;
            curlen = 0;
            dotlen = maxlen / 10;
        } else {
            memcpy(buffer, current, len);
            rlen -= len;
            current += len;
        }
    } else if (instate == 2) {
        if (len >= rlen) {
            len = rlen;
            rlen = 0;
            memcpy(buffer, current, len);
            instate = 3;
            curlen = 0;
        } else {
            memcpy(buffer, current, len);
            rlen -= len;
            current += len;
        }
    } else if (instate == 1) {
        if (len > CHUNK) len = CHUNK;
        memcpy(buffer, &filling[0], len);
        curlen += len;
        if (curlen >= maxlen) {
            rlen = strlen(hugeTests[currentTest].end);
            current = hugeTests[currentTest].end;
            instate = 2;
	} else {
            if (curlen > dotlen) {
                fprintf(stderr, ".");
                dotlen += maxlen / 10;
            }
        }
    } else
      len = 0;
    return (len);
}